

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O2

complex<double> __thiscall dlib::rand::get_random_complex_gaussian(rand *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  result_type rVar5;
  result_type rVar6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  complex<double> cVar14;
  undefined1 local_58 [16];
  
  local_58._8_8_ = 0x41efffffffe00000;
  local_58._0_8_ = 0x41efffffffe00000;
  do {
    rVar5 = random_helpers::
            mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
            ::operator()(&this->mt);
    rVar6 = random_helpers::
            mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
            ::operator()(&this->mt);
    auVar9 = vpinsrd_avx(ZEXT416(rVar5),rVar6,1);
    auVar9 = vcvtudq2pd_avx512vl(auVar9);
    auVar9 = vdivpd_avx(auVar9,local_58);
    auVar3._8_8_ = 0xbff0000000000000;
    auVar3._0_8_ = 0xbff0000000000000;
    auVar4._8_8_ = 0x4000000000000000;
    auVar4._0_8_ = 0x4000000000000000;
    auVar3 = vfmadd132pd_fma(auVar9,auVar3,auVar4);
    dVar1 = auVar3._0_8_;
    auVar9._0_8_ = dVar1 * dVar1;
    dVar2 = auVar3._8_8_;
    auVar9._8_8_ = dVar2 * dVar2;
    auVar9 = vshufpd_avx(auVar9,auVar9,1);
    auVar9 = vfmadd231sd_fma(auVar9,auVar3,auVar3);
    dVar11 = auVar9._0_8_;
  } while (1.0 <= dVar11);
  dVar10 = log(dVar11);
  auVar12._0_8_ = (dVar10 * -2.0) / dVar11;
  auVar12._8_8_ = 0;
  if (auVar12._0_8_ < 0.0) {
    dVar11 = sqrt(auVar12._0_8_);
    uVar7 = extraout_RAX_00;
    uVar8 = extraout_RDX_00;
  }
  else {
    auVar9 = vsqrtsd_avx(auVar12,auVar12);
    dVar11 = auVar9._0_8_;
    uVar7 = extraout_RAX;
    uVar8 = extraout_RDX;
  }
  auVar13._0_8_ = dVar11 * dVar1;
  auVar13._8_8_ = dVar11 * dVar2;
  vshufpd_avx(auVar13,auVar13,1);
  cVar14._M_value._8_8_ = uVar8;
  cVar14._M_value._0_8_ = uVar7;
  return (complex<double>)cVar14._M_value;
}

Assistant:

std::complex<double> get_random_complex_gaussian (
            )
            {
                double x1, x2, w;

                const double rndmax = std::numeric_limits<dlib::uint32>::max();

                // Generate a pair of Gaussian random numbers using the Box-Muller transformation.
                do 
                {
                    const double rnd1 = get_random_32bit_number()/rndmax;
                    const double rnd2 = get_random_32bit_number()/rndmax;

                    x1 = 2.0 * rnd1 - 1.0;
                    x2 = 2.0 * rnd2 - 1.0;
                    w = x1 * x1 + x2 * x2;
                } while ( w >= 1.0 );

                w = std::sqrt( (-2.0 * std::log( w ) ) / w );
                return std::complex<double>(x1 * w, x2 * w);
            }